

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O3

void __thiscall
tinyusdz::usdc::USDCReader::set_reader_config(USDCReader *this,USDCReaderConfig *config)

{
  Impl *pIVar1;
  size_t sVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  int iVar8;
  int iVar9;
  
  pIVar1 = this->impl_;
  uVar3 = config->kMaxPrimNestLevel;
  uVar4 = config->kMaxFieldValuePairs;
  uVar5 = config->kMaxTokenLength;
  uVar6 = config->kMaxStringLength;
  uVar7 = config->kMaxElementSize;
  sVar2 = config->kMaxAllowedMemoryInMB;
  (pIVar1->_config).numThreads = config->numThreads;
  (pIVar1->_config).kMaxPrimNestLevel = uVar3;
  (pIVar1->_config).kMaxFieldValuePairs = uVar4;
  (pIVar1->_config).kMaxTokenLength = uVar5;
  *(undefined4 *)((long)&(pIVar1->_config).kMaxAllowedMemoryInMB + 7) =
       *(undefined4 *)((long)&config->kMaxAllowedMemoryInMB + 7);
  (pIVar1->_config).kMaxStringLength = uVar6;
  (pIVar1->_config).kMaxElementSize = uVar7;
  (pIVar1->_config).kMaxAllowedMemoryInMB = sVar2;
  iVar9 = (pIVar1->_config).numThreads;
  if (iVar9 == -1) {
    iVar8 = ::std::thread::hardware_concurrency();
    iVar9 = 1;
    if (1 < iVar8) {
      iVar9 = iVar8;
    }
  }
  iVar8 = 0x400;
  if (iVar9 < 0x400) {
    iVar8 = iVar9;
  }
  (pIVar1->_config).numThreads = iVar8;
  return;
}

Assistant:

void USDCReader::set_reader_config(const USDCReaderConfig &config) {
  impl_->set_reader_config(config);
}